

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::MergedDescriptorDatabase::FindAllExtensionNumbers
          (MergedDescriptorDatabase *this,string *extendee_type,
          vector<int,_std::allocator<int>_> *output)

{
  pointer *ppiVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  size_type sVar5;
  reference ppDVar6;
  iterator __i;
  insert_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_> iVar7;
  insert_iterator<std::vector<int,_std::allocator<int>_>_> local_d8;
  _Rb_tree_const_iterator<int> local_c8;
  _Rb_tree_const_iterator<int> local_c0;
  insert_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_> local_b8;
  _Base_ptr local_a8;
  insert_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_> local_a0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_90;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_88;
  int local_70;
  byte local_69;
  int i;
  bool success;
  vector<int,_std::allocator<int>_> results;
  set<int,_std::less<int>,_std::allocator<int>_> merged_results;
  vector<int,_std::allocator<int>_> *output_local;
  string *extendee_type_local;
  MergedDescriptorDatabase *this_local;
  
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             &results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&i);
  local_69 = 0;
  local_70 = 0;
  while( true ) {
    uVar4 = (ulong)local_70;
    sVar5 = std::
            vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
            ::size(&this->sources_);
    if (sVar5 <= uVar4) break;
    ppDVar6 = std::
              vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
              ::operator[](&this->sources_,(long)local_70);
    uVar3 = (*(*ppDVar6)->_vptr_DescriptorDatabase[5])(*ppDVar6,extendee_type,&i);
    if ((uVar3 & 1) != 0) {
      local_88._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin
                            ((vector<int,_std::allocator<int>_> *)&i);
      local_90._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::end
                            ((vector<int,_std::allocator<int>_> *)&i);
      ppiVar1 = &results.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      local_a8 = (_Base_ptr)
                 std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                           ((set<int,_std::less<int>,_std::allocator<int>_> *)ppiVar1);
      std::insert_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_>::insert_iterator
                (&local_a0,(set<int,_std::less<int>,_std::allocator<int>_> *)ppiVar1,(_Iter)local_a8
                );
      iVar7 = std::
              copy<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::insert_iterator<std::set<int,std::less<int>,std::allocator<int>>>>
                        (local_88,local_90,local_a0);
      local_69 = 1;
      local_b8 = iVar7;
    }
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)&i);
    local_70 = local_70 + 1;
  }
  ppiVar1 = &results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  local_c0._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)ppiVar1);
  local_c8._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::end
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)ppiVar1);
  __i = std::vector<int,_std::allocator<int>_>::end(output);
  std::insert_iterator<std::vector<int,_std::allocator<int>_>_>::insert_iterator
            (&local_d8,output,(_Iter)__i._M_current);
  std::
  copy<std::_Rb_tree_const_iterator<int>,std::insert_iterator<std::vector<int,std::allocator<int>>>>
            (local_c0,local_c8,local_d8);
  bVar2 = local_69;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&i);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             &results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  return (bool)(bVar2 & 1);
}

Assistant:

bool MergedDescriptorDatabase::FindAllExtensionNumbers(
    const string& extendee_type,
    vector<int>* output) {
  set<int> merged_results;
  vector<int> results;
  bool success = false;

  for (int i = 0; i < sources_.size(); i++) {
    if (sources_[i]->FindAllExtensionNumbers(extendee_type, &results)) {
      copy(results.begin(), results.end(),
           insert_iterator<set<int> >(merged_results, merged_results.begin()));
      success = true;
    }
    results.clear();
  }

  copy(merged_results.begin(), merged_results.end(),
       insert_iterator<vector<int> >(*output, output->end()));

  return success;
}